

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtSampleRenderCase::preDraw
          (InterpolateAtSampleRenderCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_208;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  int local_28;
  int local_24;
  deInt32 rangeLoc;
  deInt32 offsetLoc;
  Functions *gl;
  deInt32 offset;
  deInt32 range;
  InterpolateAtSampleRenderCase *this_local;
  
  if (this->m_indexMode == INDEXING_DYNAMIC) {
    gl._4_4_ = (this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
               m_numTargetSamples;
    gl._0_4_ = 1;
    _offset = this;
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        super_TestCase.m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    _rangeLoc = CONCAT44(extraout_var,iVar2);
    pcVar1 = *(code **)(_rangeLoc + 0xb48);
    dVar3 = glu::ShaderProgram::getProgram
                      ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                       m_program);
    local_24 = (*pcVar1)(dVar3,"u_offset");
    pcVar1 = *(code **)(_rangeLoc + 0xb48);
    dVar3 = glu::ShaderProgram::getProgram
                      ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                       m_program);
    local_28 = (*pcVar1)(dVar3,"u_range");
    if (local_24 == -1) {
      local_5d = 1;
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Location of u_offset was -1",&local_49);
      tcu::TestError::TestError(pTVar5,&local_48);
      local_5d = 0;
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_28 == -1) {
      local_82 = 1;
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Location of u_range was -1",&local_81);
      tcu::TestError::TestError(pTVar5,&local_80);
      local_82 = 0;
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(_rangeLoc + 0x14f0))(local_24,0);
    (**(code **)(_rangeLoc + 0x14f0))
              (local_28,(this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        m_numTargetSamples);
    dVar3 = (**(code **)(_rangeLoc + 0x800))();
    glu::checkError(dVar3,"set uniforms",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                    ,0x1be);
    this_00 = tcu::TestContext::getLog
                        ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                         super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_208,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [16])"Set u_offset = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&gl);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"Set u_range = ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&gl + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_208);
  }
  return;
}

Assistant:

void InterpolateAtSampleRenderCase::preDraw (void)
{
	if (m_indexMode == INDEXING_DYNAMIC)
	{
		const deInt32			range		= m_numTargetSamples;
		const deInt32			offset		= 1;
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const deInt32			offsetLoc	= gl.getUniformLocation(m_program->getProgram(), "u_offset");
		const deInt32			rangeLoc	= gl.getUniformLocation(m_program->getProgram(), "u_range");

		if (offsetLoc == -1)
			throw tcu::TestError("Location of u_offset was -1");
		if (rangeLoc == -1)
			throw tcu::TestError("Location of u_range was -1");

		gl.uniform1i(offsetLoc, 0);
		gl.uniform1i(rangeLoc, m_numTargetSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Set u_offset = " << offset << "\n"
			<< "Set u_range = " << range
			<< tcu::TestLog::EndMessage;
	}
}